

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmuuidgen.cpp
# Opt level: O1

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  bool *pbVar1;
  byte bVar2;
  char *__s1;
  int iVar3;
  bool *pbVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  this->error_flag = true;
  pbVar1 = &this->help_flag;
  this->no_newline_flag = false;
  this->c_array_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  bVar6 = 1 < argc;
  if (1 < argc) {
    uVar5 = 2;
    do {
      __s1 = argv[uVar5 - 1];
      iVar3 = strcmp(__s1,"-help");
      pbVar4 = pbVar1;
      if (iVar3 == 0) goto LAB_001046dc;
      if (*__s1 != '-') {
LAB_00104722:
        fprintf(_stderr,"Unrecognized option: %s\n",__s1);
        if (bVar6) {
          return;
        }
        break;
      }
      bVar2 = __s1[1];
      iVar3 = isalpha((int)(char)bVar2);
      if ((iVar3 == 0) || (__s1[2] != '\0')) goto LAB_00104722;
      if (bVar2 < 0x68) {
        pbVar4 = &this->version_flag;
        if ((bVar2 != 0x56) && (pbVar4 = &this->c_array_flag, bVar2 != 99)) goto LAB_00104722;
      }
      else if ((bVar2 != 0x68) &&
              ((pbVar4 = &this->verbose_flag, bVar2 != 0x76 &&
               (pbVar4 = &this->no_newline_flag, bVar2 != 0x6e)))) goto LAB_00104722;
LAB_001046dc:
      *pbVar4 = true;
      bVar6 = uVar5 < (uint)argc;
      bVar7 = uVar5 != (uint)argc;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  if ((*pbVar1 == false) && (this->version_flag == false)) {
    this->error_flag = false;
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), no_newline_flag(false), c_array_flag(false), version_flag(false),
    help_flag(false), verbose_flag(false)
  {
    for ( int i = 1; i < argc; i++ )
      {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
     
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'c': c_array_flag = true; break;
	      case 'n': no_newline_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'V': version_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
	    return;
	  }
      }

    if ( help_flag || version_flag )
      return;
    
    error_flag = false;
  }